

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O3

CPAccessResult access_el3_aa32ns(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  CPAccessResult CVar1;
  
  CVar1 = CP_ACCESS_OK;
  if ((env->features >> 0x21 & 1) != 0) {
    CVar1 = ~(uint)(env->cp15).scr_el3 * 2 & CP_ACCESS_TRAP_UNCATEGORIZED;
  }
  if (((uint)env->features >> 0x1c & 1) == 0) {
    return CVar1;
  }
  __assert_fail("!arm_el_is_aa64(env, 3)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                ,0x5d,"CPAccessResult access_el3_aa32ns(CPUARMState *, const ARMCPRegInfo *, _Bool)"
               );
}

Assistant:

static inline bool arm_is_secure_below_el3(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_EL3)) {
        return !(env->cp15.scr_el3 & SCR_NS);
    } else {
        /* If EL3 is not supported then the secure state is implementation
         * defined, in which case QEMU defaults to non-secure.
         */
        return false;
    }
}